

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O2

opdef * addop(opdef *cur,char *nam,opctxdef *opctx)

{
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  size_t sVar4;
  opdef *poVar5;
  opdef *poVar6;
  char cVar7;
  char *pcVar8;
  char *result_buf;
  osdirhdl_t dirhdl;
  unsigned_long fmode;
  unsigned_long fattr_1;
  unsigned_long fmode_1;
  unsigned_long fattr;
  char dir_prefix [4096];
  char local_4038 [4096];
  char resname [4096];
  char fullname [4096];
  char fname [4096];
  
  if (opctx->doing_type != 0) {
    iVar1 = stricmp(nam,"xfcn");
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = stricmp(nam,"html");
      if (iVar1 == 0) {
        iVar1 = 2;
      }
      else {
        iVar1 = 0;
        printf("invalid resource type specified: %s");
        errexit("",(long)nam);
      }
    }
    opctx->restype = iVar1;
    opctx->doing_type = 0;
    return cur;
  }
  cVar7 = *nam;
  if (cVar7 == '-') {
    iVar1 = stricmp(nam,"-type");
    if (iVar1 == 0) {
      opctx->doing_type = 1;
      return cur;
    }
    iVar1 = stricmp(nam,"-replace");
    if (iVar1 == 0) {
      opctx->flag = 3;
      return cur;
    }
    iVar1 = stricmp(nam,"-delete");
    if (iVar1 == 0) {
      opctx->flag = 2;
      return cur;
    }
    iVar1 = stricmp(nam,"-add");
    if (iVar1 != 0) {
      printf("invalid option: %s");
      errexit("",(long)nam);
      return cur;
    }
    opctx->flag = 1;
    return cur;
  }
  pcVar8 = nam + 1;
  while (cVar7 != '\0') {
    if (cVar7 == '=') {
      pcVar8[-1] = '\0';
      goto LAB_0010602b;
    }
    cVar7 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  }
  result_buf = resname;
  os_cvt_dir_url(result_buf,0x1000,nam);
  goto LAB_00106065;
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    pcVar8 = result_buf + 1;
    if ((*(byte *)((long)*ppuVar2 + (long)cVar7 * 2 + 1) & 0x20) == 0) break;
LAB_0010602b:
    result_buf = pcVar8;
    cVar7 = *result_buf;
    if ((long)cVar7 < 0) break;
  }
LAB_00106065:
  iVar1 = osfmode(nam,1,&fmode,&fattr);
  if ((iVar1 == 0) || ((fmode._1_1_ & 0x40) == 0)) {
    sVar3 = strlen(result_buf);
    sVar4 = strlen(nam);
    poVar5 = (opdef *)malloc(sVar3 + sVar4 + 0x22);
    poVar5->opnxt = cur;
    poVar5->opflag = opctx->flag;
    poVar5->opres = (char *)(poVar5 + 1);
    iVar1 = get_file_restype(opctx->restype,nam);
    poVar5->oprestype = iVar1;
    strcpy(poVar5->opres,result_buf);
    pcVar8 = poVar5->opres;
    sVar3 = strlen(pcVar8);
    pcVar8 = pcVar8 + sVar3 + 1;
    poVar5->opfile = pcVar8;
    strcpy(pcVar8,nam);
    cur = poVar5;
  }
  else {
    os_cvt_dir_url(dir_prefix,0xfff,nam);
    if (dir_prefix[0] != '\0') {
      sVar3 = strlen(dir_prefix);
      (dir_prefix + sVar3)[0] = '/';
      (dir_prefix + sVar3)[1] = '\0';
    }
    iVar1 = os_open_dir(nam,&dirhdl);
    if (iVar1 != 0) {
      while (iVar1 = os_read_dir(dirhdl,fname,0x1000), iVar1 != 0) {
        os_build_full_path(fullname,0x1000,nam,fname);
        iVar1 = osfmode(fullname,1,&fmode_1,&fattr_1);
        if (((iVar1 != 0) && ((fmode_1._1_1_ & 0x40) == 0)) && (((byte)fattr_1 & 3) == 0)) {
          sprintf(local_4038,"%s%s",dir_prefix,fname);
          sVar3 = strlen(local_4038);
          sVar4 = strlen(fullname);
          poVar6 = (opdef *)malloc(sVar3 + sVar4 + 0x22);
          poVar6->opnxt = cur;
          poVar6->opflag = opctx->flag;
          iVar1 = get_file_restype(opctx->restype,fname);
          poVar6->oprestype = iVar1;
          poVar5 = poVar6 + 1;
          poVar6->opres = (char *)poVar5;
          strcpy((char *)poVar5,local_4038);
          sVar3 = strlen((char *)poVar5);
          pcVar8 = (char *)((long)&poVar6[1].opnxt + sVar3 + 1);
          poVar6->opfile = pcVar8;
          strcpy(pcVar8,fullname);
          cur = poVar6;
        }
      }
      os_close_dir(dirhdl);
    }
  }
  return cur;
}

Assistant:

static opdef *addop(opdef *cur, char *nam, opctxdef *opctx)
{
    char  *p;
    opdef *newop;
    char   resname[OSFNMAX];
    unsigned long fmode;
    unsigned long fattr;

    /* see if we're parsing a -type argument */
    if (opctx->doing_type)
    {
        /* 
         *   parse the type name, and store it as the type for following
         *   resources
         */
        opctx->restype = parse_res_type(nam);
        
        /* we're done parsing the -type argument */
        opctx->doing_type = FALSE;

        /* 
         *   we're done parsing this argument - we haven't added any
         *   operations, so return old list head 
         */
        return cur;
    }

    /* see if we have an option */
    if (*nam == '-')
    {
        /* see what we have */
        if (!stricmp(nam, "-type"))
        {
            /* 
             *   note that we're doing a type, so we parse it on the next
             *   argument 
             */
            opctx->doing_type = TRUE;
        }
        else if (!stricmp(nam, "-replace"))
        {
            /* set current flags to replace */
            opctx->flag = OPFADD | OPFDEL;
        }
        else if (!stricmp(nam, "-delete"))
        {
            /* set current flags to delete */
            opctx->flag = OPFDEL;
        }
        else if (!stricmp(nam, "-add"))
        {
            /* set current flags to add */
            opctx->flag = OPFADD;
        }
        else
        {
            /* invalid argument */
            rscptf("invalid option: %s", nam);
            errexit("", 1);
        }

        /* 
         *   done parsing this option - we didn't add a new operation, so
         *   return the current list head 
         */
        return cur;
    }

    /* look for '=' */
    for (p = nam ; *p && *p != '=' ; ++p);
    if (*p == '=')
    {
        /* 
         *   We found an '=', so an explicit resource name follows - use
         *   the given string as the resource name rather than basing the
         *   resource name on the filename.  First, overwrite the '=' with
         *   a null byte so that the filename string is terminated.  
         */
        *p = '\0';

        /* skip the '=' (now the null byte, of course) */
        ++p;

        /* 
         *   skip any spaces after the '='; leave p pointing to the start
         *   of the resource name 
         */
        while (t_isspace(*p))
            ++p;
    }
    else
    {
        /* 
         *   A resource name wasn't specified - synthesize a resource name
         *   based on the filename by converting from the local file system
         *   name to a relative URL 
         */
        os_cvt_dir_url(resname, sizeof(resname), nam);

        /* point p to the synthesized resource name */
        p = resname;
    }
    
    /*
     *   If we're adding a directory, rather than returning a single op
     *   for the directory, expand the directory into ops for for all of
     *   the files in the directory. 
     */
    if (osfmode(nam, TRUE, &fmode, &fattr)
        && (fmode & OSFMODE_DIR) != 0)
        return addopdir(cur, nam, opctx);
    
    /* allocate space and set up new op */
    newop = (opdef *)malloc(sizeof(opdef) + strlen(p) + strlen(nam) + 2);

    newop->opnxt  = cur;
    newop->opflag = opctx->flag;
    newop->opres  = (char *)(newop + 1);
    newop->oprestype = get_file_restype(opctx->restype, nam);
    strcpy(newop->opres, p);
    newop->opfile = newop->opres + strlen(newop->opres) + 1;
    strcpy(newop->opfile, nam);

    return(newop);
}